

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.hpp
# Opt level: O2

hugeint_t duckdb::VectorTryCastOperator<duckdb::NumericTryCast>::Operation<short,duckdb::hugeint_t>
                    (short input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  bool bVar1;
  short input_00;
  hugeint_t hVar2;
  hugeint_t output;
  hugeint_t local_58;
  string local_48;
  
  bVar1 = Hugeint::TryConvert<short>(input,&local_58);
  if (!bVar1) {
    CastExceptionText<short,duckdb::hugeint_t>(&local_48,(duckdb *)(ulong)(uint)(int)input,input_00)
    ;
    hVar2 = HandleVectorCastError::Operation<duckdb::hugeint_t>
                      (&local_48,mask,idx,(VectorTryCastData *)dataptr);
    ::std::__cxx11::string::~string((string *)&local_48);
    local_58 = hVar2;
  }
  return local_58;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		RESULT_TYPE output;
		if (DUCKDB_LIKELY(OP::template Operation<INPUT_TYPE, RESULT_TYPE>(input, output))) {
			return output;
		}
		auto data = reinterpret_cast<VectorTryCastData *>(dataptr);
		return HandleVectorCastError::Operation<RESULT_TYPE>(CastExceptionText<INPUT_TYPE, RESULT_TYPE>(input), mask,
		                                                     idx, *data);
	}